

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,1,2,1,1,2>,Eigen::Block<Eigen::Matrix<double,_1,2,1,_1,2>const,1,2,true>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,_1,_2,_1,_1,_2> *dst,
               Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true> *src,
               assign_op<double,_double> *func)

{
  double dVar1;
  SrcEvaluatorType srcEvaluator;
  block_evaluator<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true,_true> local_20;
  
  block_evaluator<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_1,_2,_true,_true>::block_evaluator
            (&local_20,src);
  dVar1 = local_20.
          super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
          .m_data[1];
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array[0] =
       *local_20.
        super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
        .m_data;
  (dst->super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>).m_storage.m_data.array[1] =
       dVar1;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}